

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O1

void __thiscall Secp256K1::Secp256K1(Secp256K1 *this,string *privateKey)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  secp256k1_context *psVar4;
  Secp256K1Exception *this_00;
  char *error;
  string priv;
  string local_40;
  
  psVar4 = secp256k1_context_create(0x301);
  this->ctx = psVar4;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pubKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->privKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  base16Decode(&local_40,privateKey);
  pcVar1 = (privateKey->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->privKey,pcVar1,
             pcVar1 + privateKey->_M_string_length);
  iVar3 = secp256k1_ec_seckey_verify
                    (this->ctx,
                     (this->privKey).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    error = "Unable to create and verify key:  ";
  }
  else {
    bVar2 = createPublicKey(this,false);
    if (bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    error = "Unable to create publick key";
  }
  this_00 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
  Secp256K1Exception::Secp256K1Exception(this_00,error);
  __cxa_throw(this_00,&Secp256K1Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Secp256K1::Secp256K1(const std::string& privateKey)
    : ctx(secp256k1_context_create(SECP256K1_CONTEXT_SIGN | SECP256K1_CONTEXT_VERIFY))
{
    auto priv = Secp256K1::base16Decode(privateKey);

    privKey.assign(privateKey.begin(), privateKey.end());
    //verify priv key
    if (!verifyKey()) {
        throw Secp256K1Exception("Unable to create and verify key:  ");
    }

//    std::cout << privKey.data();

    if (!createPublicKey()) {
        throw Secp256K1Exception("Unable to create publick key");
    }
}